

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

void nonstd::sv_lite::detail::write_padding<std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *os,streamsize n)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  if (0 < n) {
    lVar2 = n;
  }
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    uVar1 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0xe8);
    std::ios::fill();
    std::streambuf::sputc((char)uVar1);
  }
  return;
}

Assistant:

void write_padding( Stream & os, std::streamsize n )
{
    for ( std::streamsize i = 0; i < n; ++i )
        os.rdbuf()->sputc( os.fill() );
}